

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VdbeSetSql(Vdbe *p,char *z,int n,u8 prepFlags)

{
  char *pcVar1;
  u8 prepFlags_local;
  int n_local;
  char *z_local;
  Vdbe *p_local;
  
  if (p != (Vdbe *)0x0) {
    p->prepFlags = prepFlags;
    if ((prepFlags & 0x80) == 0) {
      p->expmask = 0;
    }
    pcVar1 = sqlite3DbStrNDup(p->db,z,(long)n);
    p->zSql = pcVar1;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeSetSql(Vdbe *p, const char *z, int n, u8 prepFlags){
  if( p==0 ) return;
  p->prepFlags = prepFlags;
  if( (prepFlags & SQLITE_PREPARE_SAVESQL)==0 ){
    p->expmask = 0;
  }
  assert( p->zSql==0 );
  p->zSql = sqlite3DbStrNDup(p->db, z, n);
}